

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_default_vfs_read(ma_vfs *pVFS,ma_vfs_file file,void *pDst,size_t sizeInBytes,
                             size_t *pBytesRead)

{
  int iVar1;
  ma_result mVar2;
  size_t sVar3;
  
  if (pBytesRead != (size_t *)0x0) {
    *pBytesRead = 0;
  }
  mVar2 = MA_INVALID_ARGS;
  if (pDst != (void *)0x0 && file != (ma_vfs_file)0x0) {
    sVar3 = fread(pDst,1,sizeInBytes,(FILE *)file);
    if (pBytesRead != (size_t *)0x0) {
      *pBytesRead = sVar3;
    }
    mVar2 = MA_SUCCESS;
    if (sVar3 != sizeInBytes) {
      if ((sVar3 == 0) && (iVar1 = feof((FILE *)file), iVar1 != 0)) {
        return MA_AT_END;
      }
      iVar1 = ferror((FILE *)file);
      mVar2 = ma_result_from_errno(iVar1);
      return mVar2;
    }
  }
  return mVar2;
}

Assistant:

static ma_result ma_default_vfs_read(ma_vfs* pVFS, ma_vfs_file file, void* pDst, size_t sizeInBytes, size_t* pBytesRead)
{
    if (pBytesRead != NULL) {
        *pBytesRead = 0;
    }

    if (file == NULL || pDst == NULL) {
        return MA_INVALID_ARGS;
    }

#if defined(MA_USE_WIN32_FILEIO)
    return ma_default_vfs_read__win32(pVFS, file, pDst, sizeInBytes, pBytesRead);
#else
    return ma_default_vfs_read__stdio(pVFS, file, pDst, sizeInBytes, pBytesRead);
#endif
}